

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

void __thiscall
cmFilePathChecksum::cmFilePathChecksum(cmFilePathChecksum *this,cmMakefile *makefile)

{
  string *currentSrcDir;
  string *currentBinDir;
  string *projectSrcDir;
  string *projectBinDir;
  cmMakefile *makefile_local;
  cmFilePathChecksum *this_local;
  
  std::
  array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
  ::array(&this->parentDirs);
  currentSrcDir = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(makefile);
  currentBinDir = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(makefile);
  projectSrcDir = cmMakefile::GetHomeDirectory_abi_cxx11_(makefile);
  projectBinDir = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(makefile);
  setupParentDirs(this,currentSrcDir,currentBinDir,projectSrcDir,projectBinDir);
  return;
}

Assistant:

cmFilePathChecksum::cmFilePathChecksum(cmMakefile* makefile)
{
  this->setupParentDirs(makefile->GetCurrentSourceDirectory(),
                        makefile->GetCurrentBinaryDirectory(),
                        makefile->GetHomeDirectory(),
                        makefile->GetHomeOutputDirectory());
}